

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# my_pthread_rwlock.c
# Opt level: O3

int my_pthread_rwlock_wrlock(my_pthread_rwlock_t *rw)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  __pthread_unwind_buf_t __cancel_buf;
  pthread_mutex_t apStack_98 [2];
  
  __mutex = apStack_98;
  iVar1 = 0x16;
  if ((rw->rw_magic == 0x19283746) &&
     (iVar1 = pthread_mutex_lock((pthread_mutex_t *)rw), iVar1 == 0)) {
    do {
      if (rw->rw_refcount == 0) {
        rw->rw_refcount = -1;
        iVar1 = 0;
        break;
      }
      rw->rw_nwaitwriters = rw->rw_nwaitwriters + 1;
      iVar1 = __sigsetjmp(apStack_98,0);
      if (iVar1 != 0) {
        my_rwlock_cancelwrwait(rw);
        __pthread_unwind_next((__pthread_unwind_buf_t *)&apStack_98[0].__data);
        *(int *)((long)__mutex + 0x90) = *(int *)((long)__mutex + 0x90) + -1;
        iVar1 = pthread_mutex_unlock(__mutex);
        return iVar1;
      }
      __pthread_register_cancel((__pthread_unwind_buf_t *)&apStack_98[0].__data);
      iVar1 = pthread_cond_wait((pthread_cond_t *)&rw->rw_condwriters,(pthread_mutex_t *)rw);
      __pthread_unregister_cancel((__pthread_unwind_buf_t *)&apStack_98[0].__data);
      rw->rw_nwaitwriters = rw->rw_nwaitwriters + -1;
    } while (iVar1 == 0);
    pthread_mutex_unlock((pthread_mutex_t *)rw);
  }
  return iVar1;
}

Assistant:

int my_pthread_rwlock_wrlock(my_pthread_rwlock_t *rw) {
    int result;

    if (rw->rw_magic != RW_MAGIC) {
        return EINVAL;
    }

    if ((result = pthread_mutex_lock(&rw->rw_mutex)) != 0) {
        return result;
    }

    while (rw->rw_refcount != 0) {
        rw->rw_nwaitwriters += 1;
        pthread_cleanup_push(&my_rwlock_cancelwrwait, rw);
        result = pthread_cond_wait(&rw->rw_condwriters, &rw->rw_mutex);
        pthread_cleanup_pop(0);
        rw->rw_nwaitwriters -= 1;
        if (result != 0) {
            break;
        }
    }

    if (result == 0) {
        rw->rw_refcount = -1;
    }
    pthread_mutex_unlock(&rw->rw_mutex);
    return result;
}